

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QtPrivate::QCalendarModel::setCalendar(QCalendarModel *this,QCalendar c)

{
  long lVar1;
  undefined4 uVar2;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QCalendarModel *in_stack_00000008;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)(in_RDI + 0x18) = in_RSI;
  uVar2 = QDate::year(in_RDI + 0x20,in_RSI);
  *(undefined4 *)(in_RDI + 0x38) = uVar2;
  uVar2 = QDate::month(in_RDI + 0x20,in_RSI);
  *(undefined4 *)(in_RDI + 0x3c) = uVar2;
  internalUpdate(in_stack_00000008);
  QCalendarView::internalUpdate((QCalendarView *)0x51980f);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarModel::setCalendar(QCalendar c)
{
    m_calendar = c;
    m_shownYear = m_date.year(c);
    m_shownMonth = m_date.month(c);
    internalUpdate();
    m_view->internalUpdate();
}